

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O0

void duckdb::AggregateExecutor::Combine<duckdb::KahanAvgState,duckdb::KahanAverageOperation>
               (Vector *source,Vector *target,AggregateInputData *aggr_input_data,idx_t count)

{
  KahanAvgState *source_00;
  KahanAvgState *in_RCX;
  idx_t i;
  KahanAvgState **tdata;
  KahanAvgState **sdata;
  KahanAvgState *target_00;
  
  FlatVector::GetData<duckdb::KahanAvgState_const*>((Vector *)0x824992);
  source_00 = (KahanAvgState *)FlatVector::GetData<duckdb::KahanAvgState*>((Vector *)0x8249a1);
  for (target_00 = (KahanAvgState *)0x0; target_00 < in_RCX;
      target_00 = (KahanAvgState *)((long)&target_00->count + 1)) {
    BaseSumOperation<duckdb::AverageSetOperation,duckdb::KahanAdd>::
    Combine<duckdb::KahanAvgState,duckdb::KahanAverageOperation>
              (source_00,target_00,(AggregateInputData *)0x8249dd);
  }
  return;
}

Assistant:

static void Combine(Vector &source, Vector &target, AggregateInputData &aggr_input_data, idx_t count) {
		D_ASSERT(source.GetType().id() == LogicalTypeId::POINTER && target.GetType().id() == LogicalTypeId::POINTER);
		auto sdata = FlatVector::GetData<const STATE_TYPE *>(source);
		auto tdata = FlatVector::GetData<STATE_TYPE *>(target);

		for (idx_t i = 0; i < count; i++) {
			OP::template Combine<STATE_TYPE, OP>(*sdata[i], *tdata[i], aggr_input_data);
		}
	}